

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::do_call
          (Dynamic_Object_Constructor *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  initializer_list<chaiscript::Boxed_Value> __l;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  const_iterator in_RSI;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  in_RDI;
  Boxed_Value BVar2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> new_params;
  Boxed_Value *bv;
  string *in_stack_fffffffffffffe68;
  Dynamic_Object *in_stack_fffffffffffffe70;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *this_00;
  allocator_type *in_stack_fffffffffffffe98;
  Type_Conversions_State **ppTVar3;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffea0;
  Type_Conversions_State **ppTVar4;
  Type_Conversions_State *t_conversions_00;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *this_01;
  __normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  __first;
  undefined1 in_stack_fffffffffffffee7;
  Dynamic_Object *in_stack_fffffffffffffee8;
  Boxed_Value *in_stack_fffffffffffffef0;
  undefined1 local_e9 [17];
  Type_Conversions_State *local_d8;
  undefined8 local_d0;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_c8;
  string local_a0 [127];
  byte local_21;
  
  local_21 = 0;
  __first._M_current = in_RDI._M_current;
  std::__cxx11::string::string
            (local_a0,(string *)
                      &in_RSI._M_current[2].m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  Dynamic_Object::Dynamic_Object(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(bool)in_stack_fffffffffffffee7);
  Dynamic_Object::~Dynamic_Object(in_stack_fffffffffffffe70);
  std::__cxx11::string::~string(local_a0);
  t_conversions_00 = (Type_Conversions_State *)(local_e9 + 1);
  Boxed_Value::Boxed_Value
            ((Boxed_Value *)in_stack_fffffffffffffe70,(Boxed_Value *)in_stack_fffffffffffffe68);
  local_d0 = 1;
  this_01 = (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_e9;
  local_d8 = t_conversions_00;
  std::allocator<chaiscript::Boxed_Value>::allocator((allocator<chaiscript::Boxed_Value> *)0x2622e8)
  ;
  __l._M_len = (size_type)this_01;
  __l._M_array = (iterator)t_conversions_00;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (in_stack_fffffffffffffea0,__l,in_stack_fffffffffffffe98);
  std::allocator<chaiscript::Boxed_Value>::~allocator
            ((allocator<chaiscript::Boxed_Value> *)0x262319);
  ppTVar3 = (Type_Conversions_State **)(local_e9 + 1);
  ppTVar4 = &local_d8;
  do {
    ppTVar4 = ppTVar4 + -2;
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x262342);
  } while (ppTVar4 != ppTVar3);
  this_00 = &local_c8;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             in_stack_fffffffffffffe68);
  __gnu_cxx::
  __normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
  ::__normal_iterator<chaiscript::Boxed_Value*>
            ((__normal_iterator<const_chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
              *)in_stack_fffffffffffffe70,
             (__normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
              *)in_stack_fffffffffffffe68);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             in_stack_fffffffffffffe68);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             in_stack_fffffffffffffe68);
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  insert<__gnu_cxx::__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,void>
            (this_01,in_RSI,__first,in_RDI);
  std::
  __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)in_stack_fffffffffffffe70);
  Proxy_Function_Base::operator()((Proxy_Function_Base *)in_RDI._M_current,this_01,t_conversions_00)
  ;
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x26241c);
  local_21 = 1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(this_00);
  _Var1._M_pi = extraout_RDX;
  if ((local_21 & 1) == 0) {
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x262518);
    _Var1._M_pi = extraout_RDX_00;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)__first._M_current;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
          {
            auto bv = Boxed_Value(Dynamic_Object(m_type_name), true);
            std::vector<Boxed_Value> new_params{bv};
            new_params.insert(new_params.end(), params.begin(), params.end());

            (*m_func)(new_params, t_conversions);

            return bv;
          }